

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QSslEllipticCurve>::emplace<QSslEllipticCurve_const&>
          (QPodArrayOps<QSslEllipticCurve> *this,qsizetype i,QSslEllipticCurve *args)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  qsizetype qVar4;
  QSslEllipticCurve *pQVar5;
  int *in_RDX;
  QArrayDataPointer<QSslEllipticCurve> *in_RSI;
  QArrayDataPointer<QSslEllipticCurve> *in_RDI;
  long in_FS_OFFSET;
  QSslEllipticCurve *where;
  GrowthPosition pos;
  bool detach;
  QSslEllipticCurve tmp;
  QArrayDataPointer<QSslEllipticCurve> *in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QArrayDataPointer<QSslEllipticCurve>::needsDetach(in_RDI);
  uVar7 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffd4);
  if (!bVar3) {
    if ((in_RSI == (QArrayDataPointer<QSslEllipticCurve> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<QSslEllipticCurve>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QSslEllipticCurve>::end(in_RDI);
      pQVar5->id = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_003ae25d;
    }
    if ((in_RSI == (QArrayDataPointer<QSslEllipticCurve> *)0x0) &&
       (qVar4 = QArrayDataPointer<QSslEllipticCurve>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QSslEllipticCurve>::begin
                         ((QArrayDataPointer<QSslEllipticCurve> *)0x3ae1b3);
      pQVar5[-1].id = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_003ae25d;
    }
  }
  iVar1 = *in_RDX;
  uVar6 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<QSslEllipticCurve> *)0x0)) {
    uVar6 = 1;
  }
  QArrayDataPointer<QSslEllipticCurve>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar7,uVar6),
             (QSslEllipticCurve **)in_stack_ffffffffffffffc8,in_RDI);
  pQVar5 = createHole((QPodArrayOps<QSslEllipticCurve> *)in_RSI,
                      (GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar7,uVar6),
                      (qsizetype)in_stack_ffffffffffffffc8);
  pQVar5->id = iVar1;
LAB_003ae25d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }